

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
* testing::internal::edit_distance::CalculateOptimalEdits
            (vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             *__return_storage_ptr__,vector<unsigned_long,_std::allocator<unsigned_long>_> *left,
            vector<unsigned_long,_std::allocator<unsigned_long>_> *right)

{
  double dVar1;
  double dVar2;
  double dVar3;
  pointer puVar4;
  pointer puVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pEVar8;
  pointer pEVar9;
  EditType EVar10;
  size_t l_i;
  long lVar11;
  ulong uVar12;
  long lVar13;
  size_t r_i_1;
  long lVar14;
  long lVar15;
  size_t l_i_1;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 local_90 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  costs;
  undefined1 local_70 [8];
  EditType move;
  undefined1 local_58 [8];
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  best_move;
  allocator_type local_32;
  allocator_type local_31;
  
  puVar4 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  best_move.
  super__Vector_base<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)right;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_58,
             ((long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) + 1,(allocator_type *)local_70);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_90,((long)puVar5 - (long)puVar4 >> 3) + 1,(value_type *)local_58,&local_31);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)local_58);
  puVar4 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  std::
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  ::vector((vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
            *)local_70,
           ((long)((best_move.
                    super__Vector_base<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)((best_move.
                    super__Vector_base<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3) + 1,(allocator_type *)&local_31);
  std::
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  ::vector((vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
            *)local_58,((long)puVar5 - (long)puVar4 >> 3) + 1,(value_type *)local_70,&local_32);
  std::
  _Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  ::~_Vector_base((_Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                   *)local_70);
  lVar13 = 0;
  for (lVar11 = 0;
      ((long)costs.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start - (long)local_90) / 0x18 != lVar11;
      lVar11 = lVar11 + 1) {
    auVar16._8_4_ = (int)((ulong)lVar11 >> 0x20);
    auVar16._0_8_ = lVar11;
    auVar16._12_4_ = 0x45300000;
    **(double **)
      ((long)&(((_Vector_base<double,_std::allocator<double>_> *)local_90)->_M_impl).
              super__Vector_impl_data._M_start + lVar13) =
         (auVar16._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
    **(undefined4 **)
      ((long)&(((_Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                 *)local_58)->_M_impl).super__Vector_impl_data._M_start + lVar13) = 2;
    lVar13 = lVar13 + 0x18;
  }
  pdVar6 = (((_Vector_base<double,_std::allocator<double>_> *)local_90)->_M_impl).
           super__Vector_impl_data._M_start;
  pdVar7 = (((_Vector_base<double,_std::allocator<double>_> *)local_90)->_M_impl).
           super__Vector_impl_data._M_finish;
  for (uVar12 = 1; uVar12 < (ulong)((long)pdVar7 - (long)pdVar6 >> 3); uVar12 = uVar12 + 1) {
    auVar17._8_4_ = (int)(uVar12 >> 0x20);
    auVar17._0_8_ = uVar12;
    auVar17._12_4_ = 0x45300000;
    pdVar6[uVar12] =
         (auVar17._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0);
    (((_Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
       *)local_58)->_M_impl).super__Vector_impl_data._M_start[uVar12] = kAdd;
  }
  puVar4 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar13 = (long)(left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar4 >> 3;
  pEVar8 = ((best_move.
             super__Vector_base<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
           super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pEVar9 = ((best_move.
             super__Vector_base<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
           super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar11 = 0;
  while (lVar15 = lVar11, lVar15 != lVar13) {
    for (lVar14 = 0; lVar11 = lVar15 + 1, (long)pEVar9 - (long)pEVar8 >> 3 != lVar14;
        lVar14 = lVar14 + 1) {
      if (puVar4[lVar15] == *(undefined8 *)(pEVar8 + lVar14 * 2)) {
        (((pointer)((long)local_90 + (lVar15 + 1) * 0x18))->
        super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_start[lVar14 + 1] =
             (((pointer)((long)local_90 + lVar15 * 0x18))->
             super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
             _M_start[lVar14];
        EVar10 = kMatch;
      }
      else {
        pdVar6 = (((pointer)((long)local_90 + (lVar15 + 1) * 0x18))->
                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        dVar1 = pdVar6[lVar14];
        pdVar7 = (((pointer)((long)local_90 + lVar15 * 0x18))->
                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        dVar2 = pdVar7[lVar14];
        dVar3 = pdVar7[lVar14 + 1];
        if ((dVar3 <= dVar1) || (dVar2 <= dVar1)) {
          if ((dVar1 <= dVar3) || (dVar2 <= dVar3)) {
            pdVar6[lVar14 + 1] = dVar2 + 1.00001;
            EVar10 = kReplace;
          }
          else {
            pdVar6[lVar14 + 1] = dVar3 + 1.0;
            EVar10 = kRemove;
          }
        }
        else {
          pdVar6[lVar14 + 1] = dVar1 + 1.0;
          EVar10 = kAdd;
        }
      }
      (((pointer)((long)local_58 + (lVar15 + 1) * 0x18))->
      super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
      )._M_impl.super__Vector_impl_data._M_start[lVar14 + 1] = EVar10;
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar11 = (long)((best_move.
                   super__Vector_base<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                 super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)((best_move.
                   super__Vector_base<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                 super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3;
  costs.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)__return_storage_ptr__;
  for (; lVar13 != 0 || lVar11 != 0; lVar13 = lVar13 - (ulong)(local_70._0_4_ != kAdd)) {
    local_70._0_4_ =
         (((pointer)((long)local_58 + lVar13 * 0x18))->
         super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
         )._M_impl.super__Vector_impl_data._M_start[lVar11];
    std::
    vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_70);
    lVar11 = lVar11 - (ulong)(local_70._0_4_ != kRemove);
  }
  std::
  __reverse<__gnu_cxx::__normal_iterator<testing::internal::edit_distance::EditType*,std::vector<testing::internal::edit_distance::EditType,std::allocator<testing::internal::edit_distance::EditType>>>>
            ((__return_storage_ptr__->
             super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (__return_storage_ptr__->
             super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  ::~vector((vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
             *)local_58);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_90);
  return __return_storage_ptr__;
}

Assistant:

std::vector<EditType> CalculateOptimalEdits(const std::vector<size_t>& left,
                                            const std::vector<size_t>& right) {
  std::vector<std::vector<double> > costs(
      left.size() + 1, std::vector<double>(right.size() + 1));
  std::vector<std::vector<EditType> > best_move(
      left.size() + 1, std::vector<EditType>(right.size() + 1));

  // Populate for empty right.
  for (size_t l_i = 0; l_i < costs.size(); ++l_i) {
    costs[l_i][0] = static_cast<double>(l_i);
    best_move[l_i][0] = kRemove;
  }
  // Populate for empty left.
  for (size_t r_i = 1; r_i < costs[0].size(); ++r_i) {
    costs[0][r_i] = static_cast<double>(r_i);
    best_move[0][r_i] = kAdd;
  }

  for (size_t l_i = 0; l_i < left.size(); ++l_i) {
    for (size_t r_i = 0; r_i < right.size(); ++r_i) {
      if (left[l_i] == right[r_i]) {
        // Found a match. Consume it.
        costs[l_i + 1][r_i + 1] = costs[l_i][r_i];
        best_move[l_i + 1][r_i + 1] = kMatch;
        continue;
      }

      const double add = costs[l_i + 1][r_i];
      const double remove = costs[l_i][r_i + 1];
      const double replace = costs[l_i][r_i];
      if (add < remove && add < replace) {
        costs[l_i + 1][r_i + 1] = add + 1;
        best_move[l_i + 1][r_i + 1] = kAdd;
      } else if (remove < add && remove < replace) {
        costs[l_i + 1][r_i + 1] = remove + 1;
        best_move[l_i + 1][r_i + 1] = kRemove;
      } else {
        // We make replace a little more expensive than add/remove to lower
        // their priority.
        costs[l_i + 1][r_i + 1] = replace + 1.00001;
        best_move[l_i + 1][r_i + 1] = kReplace;
      }
    }
  }

  // Reconstruct the best path. We do it in reverse order.
  std::vector<EditType> best_path;
  for (size_t l_i = left.size(), r_i = right.size(); l_i > 0 || r_i > 0;) {
    EditType move = best_move[l_i][r_i];
    best_path.push_back(move);
    l_i -= move != kAdd;
    r_i -= move != kRemove;
  }
  std::reverse(best_path.begin(), best_path.end());
  return best_path;
}